

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

double __thiscall
Problem_CGBG_FF::ComputeLocalProbability
          (Problem_CGBG_FF *this,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  bool bVar1;
  size_type sVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  double phI;
  Index hI;
  double p;
  iterator last;
  iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *obsHouseIndices;
  Index agI;
  Index i;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> house_scope;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff28;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff30;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff38;
  double local_90;
  _Self local_88;
  _Self local_80;
  const_iterator in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  const_reference in_stack_ffffffffffffff98;
  Problem_CGBG_FF *in_stack_ffffffffffffffa0;
  uint local_4c;
  
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x8ed709);
  local_4c = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    if (sVar2 <= local_4c) break;
    __first._M_current =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30
                    ,(size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff38._M_current =
         (uint *)std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff98 = (const_reference)in_stack_ffffffffffffff38._M_current;
    in_stack_ffffffffffffff90 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28
                   );
    in_stack_ffffffffffffff88 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28
                   );
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (in_stack_ffffffffffffff30,__first,in_stack_ffffffffffffff38);
    local_4c = local_4c + 1;
  }
  local_80._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_ffffffffffffff28);
  local_88._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 (in_stack_ffffffffffffff28);
  local_90 = 1.0;
  while( true ) {
    bVar1 = std::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<unsigned_int>::operator*
              ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 =
         (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
         ComputeHouseProbability
                   (in_stack_ffffffffffffffa0,(Index)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                    (Scope *)in_stack_ffffffffffffff90._M_current,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    in_stack_ffffffffffffff88._M_current);
    local_90 = (double)in_stack_ffffffffffffff30 * local_90;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_ffffffffffffff38._M_current,
               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x8ed8cc);
  return local_90;
}

Assistant:

double Problem_CGBG_FF::ComputeLocalProbability( 
        const Scope& tupleOfAgents,
        const vector<Index>& types
        ) const
{

    /* Let
        - si denote the fire level of house i
        - hi denote the observation of house i (by some agent left unspecified here)

       Given that 
        1) the fire levels at different houses are independent P(s)=P(s1)*...*P(sN),
        2) the observation made of different houses are independent: P(h1h2|s)=P(h1|s1)P(h2|s2)
        the following should work.
      
       assume 2 agents that observe 2 houses each:
        -agent 1 gets observations of houses 1 and 2: t1=<h1,h2>
        -agent 2 gets observations of houses 2 and 3: t2=<h2,h3>
       
       Then P(t1,t2)
        = \sum_s P(t1|s)P(t2|s)P(s)
        = \sum_{s1} \sum_{s2} \sum_{s3} [ P(h1|s1)P(h2|s2) ] * [ P(h2|s2)P(h3|s3) ] * P(s1)P(s2)P(s3)
        = [sum_{s1} P(h1|s1) P(s1)] * [sum_{s2} P(h2|s2)P(h2|s2)P(s2)] * [sum_{s3} P(h3|s3) P(s3)]

       So we can compute the probability of a joint type, as the product of a term for each house
       in the `observation scope':
          ComputeHouseProbability(h1, observations_for_h1) * 
          ComputeHouseProbability(h2, observations_for_h2) * 
          ComputeHouseProbability(h3, observations_for_h3)  
    */

    //first we detemine the houses that are 'in scope'
    std::set<Index> house_scope;
    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents.at(i);
        const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
        house_scope.insert(obsHouseIndices.begin(), obsHouseIndices.end());
#if DEBUGPROBS
        cout << "Agent " << agI << " observes houses " << PrintTools::SoftPrintVector(obsHouseIndices) << endl;
#endif
    }
#if DEBUGPROBS
    cout << "'Combined houses scope' = " << PrintTools::SoftPrintSet(house_scope) << endl;
    cout << "Computing probability term (e.g. [sum_{s2} P(h2|s2)P(h2|s2)P(s2)] ) for each house..."<<endl;
#endif
    //for each house:
    std::set<Index>::iterator it =  house_scope.begin();
    std::set<Index>::iterator last =  house_scope.end();
    double p = 1.0;
    while (it != last)
    {
        Index hI = *it;
#if DEBUGPROBS
        cout << "house " << hI << "..."<<endl;
#endif
        double phI = ComputeHouseProbability(hI, tupleOfAgents, types);
#if DEBUGPROBS
        cout << "...house " << hI << " probability term, P(h_obs,h_obs) = " << phI << endl;
#endif
        p *= phI;
        it++;
    }
    return p;
}